

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2skini.cpp
# Opt level: O3

void usage(char *command)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  if (command == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12c1e8);
  }
  else {
    sVar1 = strlen(command);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,command,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," [-t #|-m #] midifile\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"   -t #  == extract only specified track (offset from 0).\n",
             0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"   -m #  == number of events to allocate for MIDI \n",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void usage(const char* command) {
   cout << "Usage: " << command << " [-t #|-m #] midifile\n";
   cout << "   -t #  == extract only specified track (offset from 0).\n";
   cout << "   -m #  == number of events to allocate for MIDI \n";
   cout << endl;
}